

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle_decoder.cpp
# Opt level: O0

void __thiscall duckdb::RLEDecoder::InitializePage(RLEDecoder *this)

{
  LogicalTypeId LVar1;
  LogicalType *this_00;
  runtime_error *this_01;
  unsigned_long *args_1;
  ResizeableBuffer *pRVar2;
  long *in_RDI;
  shared_ptr<duckdb::ResizeableBuffer,_true> *block;
  uint64_t in_stack_ffffffffffffffb8;
  ByteBuffer *in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffd8;
  uchar **in_stack_ffffffffffffffe8;
  
  this_00 = ColumnReader::Type((ColumnReader *)*in_RDI);
  LVar1 = LogicalType::id(this_00);
  if (LVar1 != BOOLEAN) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(this_01,"RLE encoding is only supported for boolean data");
    __cxa_throw(this_01,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  args_1 = (unsigned_long *)(*in_RDI + 0x50);
  shared_ptr<duckdb::ResizeableBuffer,_true>::operator->
            ((shared_ptr<duckdb::ResizeableBuffer,_true> *)in_stack_ffffffffffffffc0);
  ByteBuffer::inc(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  pRVar2 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->
                     ((shared_ptr<duckdb::ResizeableBuffer,_true> *)in_stack_ffffffffffffffc0);
  shared_ptr<duckdb::ResizeableBuffer,_true>::operator->
            ((shared_ptr<duckdb::ResizeableBuffer,_true> *)in_stack_ffffffffffffffc0);
  make_uniq<duckdb::RleBpDecoder,unsigned_char*&,unsigned_long&,int>
            (in_stack_ffffffffffffffe8,args_1,in_stack_ffffffffffffffd8);
  unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>,_true>::operator=
            ((unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>,_true> *)
             in_stack_ffffffffffffffc0,
             (unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>,_true> *)
             pRVar2);
  unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>,_true>::~unique_ptr
            ((unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>,_true> *)
             0x23fba8e);
  return;
}

Assistant:

void RLEDecoder::InitializePage() {
	if (reader.Type().id() != LogicalTypeId::BOOLEAN) {
		throw std::runtime_error("RLE encoding is only supported for boolean data");
	}
	auto &block = reader.block;
	block->inc(sizeof(uint32_t));
	rle_decoder = make_uniq<RleBpDecoder>(block->ptr, block->len, 1);
}